

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int attach_get_rcv_settle_mode(ATTACH_HANDLE attach,receiver_settle_mode *rcv_settle_mode_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int get_single_value_result;
  AMQP_VALUE item_value;
  ATTACH_INSTANCE *attach_instance;
  uint32_t item_count;
  int result;
  receiver_settle_mode *rcv_settle_mode_value_local;
  ATTACH_HANDLE attach_local;
  
  if (attach == (ATTACH_HANDLE)0x0) {
    attach_instance._4_4_ = 0x110b;
  }
  else {
    _item_count = rcv_settle_mode_value;
    rcv_settle_mode_value_local = (receiver_settle_mode *)attach;
    iVar1 = amqpvalue_get_composite_item_count(attach->composite_value,(uint32_t *)&attach_instance)
    ;
    if (iVar1 == 0) {
      if ((uint)attach_instance < 5) {
        *_item_count = '\0';
        attach_instance._4_4_ = 0;
      }
      else {
        value = amqpvalue_get_composite_item_in_place(attach->composite_value,4);
        if ((value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type(value), AVar2 == AMQP_TYPE_NULL)) {
          *_item_count = '\0';
          attach_instance._4_4_ = 0;
        }
        else {
          iVar1 = amqpvalue_get_ubyte(value,_item_count);
          if (iVar1 == 0) {
            attach_instance._4_4_ = 0;
          }
          else {
            AVar2 = amqpvalue_get_type(value);
            if (AVar2 == AMQP_TYPE_NULL) {
              *_item_count = '\0';
              attach_instance._4_4_ = 0;
            }
            else {
              attach_instance._4_4_ = 0x112c;
            }
          }
        }
      }
    }
    else {
      attach_instance._4_4_ = 0x1113;
    }
  }
  return attach_instance._4_4_;
}

Assistant:

int attach_get_rcv_settle_mode(ATTACH_HANDLE attach, receiver_settle_mode* rcv_settle_mode_value)
{
    int result;

    if (attach == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        ATTACH_INSTANCE* attach_instance = (ATTACH_INSTANCE*)attach;
        if (amqpvalue_get_composite_item_count(attach_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 4)
            {
                *rcv_settle_mode_value = receiver_settle_mode_first;
                result = 0;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(attach_instance->composite_value, 4);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    *rcv_settle_mode_value = receiver_settle_mode_first;
                    result = 0;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_receiver_settle_mode(item_value, rcv_settle_mode_value);
                    if (get_single_value_result != 0)
                    {
                        if (amqpvalue_get_type(item_value) != AMQP_TYPE_NULL)
                        {
                            result = MU_FAILURE;
                        }
                        else
                        {
                            *rcv_settle_mode_value = receiver_settle_mode_first;
                            result = 0;
                        }
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}